

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar13 = B->content;
  if (iVar2 == *(int *)((long)pvVar13 + 0x28)) {
    lVar4 = *(long *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8);
    if (*(long *)((long)B->content + 0x10) < lVar4) {
      pvVar13 = realloc(*(void **)((long)B->content + 0x30),lVar4 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x30) = pvVar13;
      pvVar13 = realloc(*(void **)((long)pvVar3 + 0x20),lVar4 * 8);
      pvVar3 = B->content;
      *(void **)((long)pvVar3 + 0x20) = pvVar13;
      *(long *)((long)pvVar3 + 0x10) = lVar4;
    }
    SUNMatZero_Sparse(B);
    if (0 < lVar4) {
      lVar20 = *(long *)((long)A->content + 0x20);
      lVar5 = *(long *)((long)A->content + 0x30);
      lVar8 = *(long *)((long)B->content + 0x20);
      lVar18 = *(long *)((long)B->content + 0x30);
      lVar19 = 0;
      do {
        *(undefined8 *)(lVar8 + lVar19 * 8) = *(undefined8 *)(lVar20 + lVar19 * 8);
        *(undefined8 *)(lVar18 + lVar19 * 8) = *(undefined8 *)(lVar5 + lVar19 * 8);
        lVar19 = lVar19 + 1;
      } while (lVar4 != lVar19);
    }
    pvVar3 = A->content;
    lVar20 = *(long *)((long)pvVar3 + 0x18);
    if (0 < lVar20) {
      lVar5 = *(long *)((long)pvVar3 + 0x38);
      lVar8 = *(long *)((long)B->content + 0x38);
      lVar18 = 0;
      do {
        *(undefined8 *)(lVar8 + lVar18 * 8) = *(undefined8 *)(lVar5 + lVar18 * 8);
        lVar18 = lVar18 + 1;
        lVar20 = *(long *)((long)pvVar3 + 0x18);
      } while (lVar18 < lVar20);
    }
    *(long *)(*(long *)((long)B->content + 0x38) + lVar20 * 8) = lVar4;
    return 0;
  }
  lVar4 = *(long *)((long)pvVar3 + 0x38);
  lVar20 = *(long *)((long)pvVar3 + 0x20);
  lVar5 = *(long *)((long)pvVar3 + 0x30);
  uVar6 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
  uVar7 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
  lVar8 = *(long *)((long)pvVar13 + 0x38);
  lVar18 = *(long *)((long)pvVar13 + 0x20);
  lVar19 = *(long *)((long)pvVar13 + 0x30);
  uVar15 = *(ulong *)(lVar4 + uVar6 * 8);
  uVar12 = SUNMatZero_Sparse(B);
  uVar14 = (ulong)uVar12;
  if (0 < (long)uVar15) {
    uVar14 = 0;
    do {
      plVar1 = (long *)(lVar8 + *(long *)(lVar5 + uVar14 * 8) * 8);
      *plVar1 = *plVar1 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  if (0 < (long)uVar7) {
    uVar14 = 0;
    lVar17 = 0;
    do {
      lVar9 = *(long *)(lVar8 + uVar14 * 8);
      *(long *)(lVar8 + uVar14 * 8) = lVar17;
      uVar14 = uVar14 + 1;
      lVar17 = lVar9 + lVar17;
    } while (uVar7 != uVar14);
  }
  *(ulong *)(lVar8 + uVar7 * 8) = uVar15;
  if (0 < (long)uVar6) {
    uVar15 = 0;
    do {
      lVar17 = *(long *)(lVar4 + uVar15 * 8);
      uVar14 = uVar15 + 1;
      if (lVar17 < *(long *)(lVar4 + 8 + uVar15 * 8)) {
        do {
          lVar9 = *(long *)(lVar5 + lVar17 * 8);
          lVar10 = *(long *)(lVar8 + lVar9 * 8);
          *(ulong *)(lVar19 + lVar10 * 8) = uVar15;
          *(undefined8 *)(lVar18 + lVar10 * 8) = *(undefined8 *)(lVar20 + lVar17 * 8);
          plVar1 = (long *)(lVar8 + lVar9 * 8);
          *plVar1 = *plVar1 + 1;
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(long *)(lVar4 + uVar14 * 8));
      }
      uVar15 = uVar14;
    } while (uVar14 != uVar6);
  }
  if (-1 < (long)uVar7) {
    uVar14 = 0;
    uVar16 = 0;
    do {
      uVar11 = *(undefined8 *)(lVar8 + uVar14 * 8);
      *(undefined8 *)(lVar8 + uVar14 * 8) = uVar16;
      uVar14 = uVar14 + 1;
      uVar16 = uVar11;
    } while (uVar7 + 1 != uVar14);
  }
  return (SUNErrCode)uVar14;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}